

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

void duckdb::GetBitStringAggregate(LogicalType *type,AggregateFunctionSet *bitstring_agg)

{
  LogicalTypeId id;
  InternalException *this;
  LogicalType *in_RCX;
  uint *puVar1;
  long lVar2;
  undefined8 *puVar3;
  aggregate_size_t *pp_Var4;
  undefined8 *puVar5;
  vector<duckdb::AggregateFunction,_true> *pvVar6;
  byte bVar7;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  initializer_list<duckdb::LogicalType> __l_08;
  allocator_type local_431;
  vector<duckdb::AggregateFunction,_true> *local_430;
  LogicalType local_428;
  undefined1 local_410 [40];
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _func_int *local_3c8 [7];
  element_type *local_390;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_388;
  pointer local_380;
  LogicalType LStack_348;
  FunctionStability local_330;
  FunctionNullHandling FStack_32f;
  FunctionErrors FStack_32e;
  FunctionCollationHandling FStack_32d;
  undefined8 auStack_328 [8];
  code *local_2e8;
  aggregate_statistics_t local_2d8;
  code *local_2d0;
  code *local_2c8;
  AggregateOrderDependent local_2c0;
  AggregateDistinctDependent AStack_2bf;
  element_type *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  undefined1 local_2a8 [48];
  LogicalType local_278 [4];
  LogicalType local_218;
  FunctionStability local_200;
  FunctionNullHandling FStack_1ff;
  FunctionErrors FStack_1fe;
  FunctionCollationHandling FStack_1fd;
  undefined8 local_1f8 [14];
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  AggregateFunction local_178;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  bVar7 = 0;
  id = type->id_;
  local_430 = (vector<duckdb::AggregateFunction,_true> *)bitstring_agg;
  if (id < UTINYINT) {
    puVar1 = &switchD_00d3b4ed::switchdataD_013c2964;
    switch(id) {
    case TINYINT:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<signed_char>,signed_char,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l_01,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    case SMALLINT:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<short>,short,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l_02._M_len = 3;
      __l_02._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l_02,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    case INTEGER:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<int>,int,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l._M_len = 3;
      __l._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    case BIGINT:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<long>,long,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l_00,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    default:
switchD_00d3b4ed_default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_3d8._M_allocated_capacity = (size_type)local_3c8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3d8,"Unimplemented bitstring aggregate","");
      InternalException::InternalException(this,(string *)&local_3d8);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    puVar1 = &switchD_00d3b384::switchdataD_013c2974;
    switch(id) {
    case UTINYINT:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<unsigned_char>,unsigned_char,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l_07._M_len = 3;
      __l_07._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l_07,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    case USMALLINT:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<unsigned_short>,unsigned_short,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l_08._M_len = 3;
      __l_08._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l_08,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    case UINTEGER:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<unsigned_int>,unsigned_int,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l_03._M_len = 3;
      __l_03._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l_03,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    case UBIGINT:
      LogicalType::LogicalType((LogicalType *)local_410,id);
      LogicalType::LogicalType(&local_428,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<unsigned_long>,unsigned_long,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,
                 (LogicalType *)puVar1);
      LogicalType::~LogicalType(&local_428);
      LogicalType::~LogicalType((LogicalType *)local_410);
      local_2e8 = BindBitstringAgg;
      local_2d0 = BitstringAggBindData::Serialize;
      local_2c8 = BitstringAggBindData::Deserialize;
      local_2d8 = BitstringPropagateStats;
      SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
      local_178.super_BaseScalarFunction.stability = local_330;
      local_178.super_BaseScalarFunction.null_handling = FStack_32f;
      local_178.super_BaseScalarFunction.errors = FStack_32e;
      local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      pp_Var4 = &local_178.state_size;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pp_Var4 = (aggregate_size_t)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
      }
      local_178.order_dependent = local_2c0;
      local_178.distinct_dependent = AStack_2bf;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2b8;
      local_178.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                &local_430->
                 super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                )->functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar6->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_178);
      local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01996688;
      local_430 = pvVar6;
      if (local_178.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
      LogicalType::LogicalType((LogicalType *)local_2a8,id);
      LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),id);
      LogicalType::LogicalType(local_278,id);
      __l_04._M_len = 3;
      __l_04._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18),__l_04,&local_431);
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_380;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
      local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_390;
      local_390 = (element_type *)local_410._24_8_;
      _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
      local_380 = (pointer)local_3e8._M_p;
      local_410._24_8_ = 0;
      local_410._32_8_ = 0;
      local_3e8._M_p = (pointer)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_410 + 0x18));
      lVar2 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      local_2d8 = (aggregate_statistics_t)0x0;
      SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
      local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
      LogicalType::LogicalType(&local_218,&LStack_348);
      local_200 = local_330;
      FStack_1ff = FStack_32f;
      FStack_1fe = FStack_32e;
      FStack_1fd = FStack_32d;
      local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
      puVar3 = auStack_328;
      puVar5 = local_1f8;
      for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      local_1f8[0xd]._0_1_ = local_2c0;
      local_1f8[0xd]._1_1_ = AStack_2bf;
      local_188 = local_2b8;
      local_180._M_pi = local_2b0._M_pi;
      if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
        }
      }
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_430->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_2a8);
      break;
    default:
      if (id == UHUGEINT) {
        LogicalType::LogicalType((LogicalType *)local_410,UHUGEINT);
        LogicalType::LogicalType(&local_428,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,in_RCX)
        ;
        LogicalType::~LogicalType(&local_428);
        LogicalType::~LogicalType((LogicalType *)local_410);
        local_2e8 = BindBitstringAgg;
        local_2d0 = BitstringAggBindData::Serialize;
        local_2c8 = BitstringAggBindData::Deserialize;
        local_2d8 = BitstringPropagateStats;
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
        local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__BaseScalarFunction_019937c0;
        LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
        local_178.super_BaseScalarFunction.stability = local_330;
        local_178.super_BaseScalarFunction.null_handling = FStack_32f;
        local_178.super_BaseScalarFunction.errors = FStack_32e;
        local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
        local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__AggregateFunction_01996688;
        puVar3 = auStack_328;
        pp_Var4 = &local_178.state_size;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *pp_Var4 = (aggregate_size_t)*puVar3;
          puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
          pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
        }
        local_178.order_dependent = local_2c0;
        local_178.distinct_dependent = AStack_2bf;
        local_178.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_2b8;
        local_178.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                  &local_430->
                   super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                  )->functions;
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar6->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,&local_178);
        local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__AggregateFunction_01996688;
        local_430 = pvVar6;
        if (local_178.function_info.internal.
            super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.function_info.internal.
                     super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
        LogicalType::LogicalType((LogicalType *)local_2a8,UHUGEINT);
        LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),UHUGEINT);
        LogicalType::LogicalType(local_278,UHUGEINT);
        __l_05._M_len = 3;
        __l_05._M_array = (iterator)local_2a8;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_410 + 0x18),__l_05,&local_431);
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_380;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_390;
        local_390 = (element_type *)local_410._24_8_;
        _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
        local_380 = (pointer)local_3e8._M_p;
        local_410._24_8_ = 0;
        local_410._32_8_ = 0;
        local_3e8._M_p = (pointer)0x0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48)
        ;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_410 + 0x18));
        lVar2 = 0x30;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
        local_2d8 = (aggregate_statistics_t)0x0;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
        local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
        LogicalType::LogicalType(&local_218,&LStack_348);
        local_200 = local_330;
        FStack_1ff = FStack_32f;
        FStack_1fe = FStack_32e;
        FStack_1fd = FStack_32d;
        local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
        puVar3 = auStack_328;
        puVar5 = local_1f8;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar5 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        }
        local_1f8[0xd]._0_1_ = local_2c0;
        local_1f8[0xd]._1_1_ = AStack_2bf;
        local_188 = local_2b8;
        local_180._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&local_430->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,(AggregateFunction *)local_2a8);
      }
      else {
        if (id != HUGEINT) goto switchD_00d3b4ed_default;
        LogicalType::LogicalType((LogicalType *)local_410,HUGEINT);
        LogicalType::LogicalType(&local_428,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)&local_3d8,(AggregateFunction *)local_410,&local_428,in_RCX)
        ;
        LogicalType::~LogicalType(&local_428);
        LogicalType::~LogicalType((LogicalType *)local_410);
        local_2e8 = BindBitstringAgg;
        local_2d0 = BitstringAggBindData::Serialize;
        local_2c8 = BitstringAggBindData::Deserialize;
        local_2d8 = BitstringPropagateStats;
        SimpleFunction::SimpleFunction((SimpleFunction *)&local_178,(SimpleFunction *)&local_3d8);
        local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__BaseScalarFunction_019937c0;
        LogicalType::LogicalType(&local_178.super_BaseScalarFunction.return_type,&LStack_348);
        local_178.super_BaseScalarFunction.stability = local_330;
        local_178.super_BaseScalarFunction.null_handling = FStack_32f;
        local_178.super_BaseScalarFunction.errors = FStack_32e;
        local_178.super_BaseScalarFunction.collation_handling = FStack_32d;
        local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__AggregateFunction_01996688;
        puVar3 = auStack_328;
        pp_Var4 = &local_178.state_size;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *pp_Var4 = (aggregate_size_t)*puVar3;
          puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
          pp_Var4 = pp_Var4 + (ulong)bVar7 * -2 + 1;
        }
        local_178.order_dependent = local_2c0;
        local_178.distinct_dependent = AStack_2bf;
        local_178.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_2b8;
        local_178.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        pvVar6 = &((FunctionSet<duckdb::AggregateFunction> *)
                  &local_430->
                   super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                  )->functions;
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar6->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,&local_178);
        local_178.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__AggregateFunction_01996688;
        local_430 = pvVar6;
        if (local_178.function_info.internal.
            super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.function_info.internal.
                     super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_178.super_BaseScalarFunction);
        LogicalType::LogicalType((LogicalType *)local_2a8,HUGEINT);
        LogicalType::LogicalType((LogicalType *)(local_2a8 + 0x18),HUGEINT);
        LogicalType::LogicalType(local_278,HUGEINT);
        __l_06._M_len = 3;
        __l_06._M_array = (iterator)local_2a8;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_410 + 0x18),__l_06,&local_431);
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_380;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_388._M_pi;
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_390;
        local_390 = (element_type *)local_410._24_8_;
        _Stack_388._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_410._32_8_;
        local_380 = (pointer)local_3e8._M_p;
        local_410._24_8_ = 0;
        local_410._32_8_ = 0;
        local_3e8._M_p = (pointer)0x0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48)
        ;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_410 + 0x18));
        lVar2 = 0x30;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_2a8 + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
        local_2d8 = (aggregate_statistics_t)0x0;
        SimpleFunction::SimpleFunction((SimpleFunction *)local_2a8,(SimpleFunction *)&local_3d8);
        local_2a8._0_8_ = &PTR__BaseScalarFunction_019937c0;
        LogicalType::LogicalType(&local_218,&LStack_348);
        local_200 = local_330;
        FStack_1ff = FStack_32f;
        FStack_1fe = FStack_32e;
        FStack_1fd = FStack_32d;
        local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
        puVar3 = auStack_328;
        puVar5 = local_1f8;
        for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar5 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        }
        local_1f8[0xd]._0_1_ = local_2c0;
        local_1f8[0xd]._1_1_ = AStack_2bf;
        local_188 = local_2b8;
        local_180._M_pi = local_2b0._M_pi;
        if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_2b0._M_pi)->_M_use_count = (local_2b0._M_pi)->_M_use_count + 1;
          }
        }
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&local_430->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,(AggregateFunction *)local_2a8);
      }
    }
  }
  local_2a8._0_8_ = &PTR__AggregateFunction_01996688;
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_2a8);
  local_3d8._M_allocated_capacity = (size_type)&PTR__AggregateFunction_01996688;
  if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)&local_3d8);
  return;
}

Assistant:

void GetBitStringAggregate(const LogicalType &type, AggregateFunctionSet &bitstring_agg) {
	switch (type.id()) {
	case LogicalType::TINYINT: {
		return BindBitString<int8_t>(bitstring_agg, type.id());
	}
	case LogicalType::SMALLINT: {
		return BindBitString<int16_t>(bitstring_agg, type.id());
	}
	case LogicalType::INTEGER: {
		return BindBitString<int32_t>(bitstring_agg, type.id());
	}
	case LogicalType::BIGINT: {
		return BindBitString<int64_t>(bitstring_agg, type.id());
	}
	case LogicalType::HUGEINT: {
		return BindBitString<hugeint_t>(bitstring_agg, type.id());
	}
	case LogicalType::UTINYINT: {
		return BindBitString<uint8_t>(bitstring_agg, type.id());
	}
	case LogicalType::USMALLINT: {
		return BindBitString<uint16_t>(bitstring_agg, type.id());
	}
	case LogicalType::UINTEGER: {
		return BindBitString<uint32_t>(bitstring_agg, type.id());
	}
	case LogicalType::UBIGINT: {
		return BindBitString<uint64_t>(bitstring_agg, type.id());
	}
	case LogicalType::UHUGEINT: {
		return BindBitString<uhugeint_t>(bitstring_agg, type.id());
	}
	default:
		throw InternalException("Unimplemented bitstring aggregate");
	}
}